

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

void __thiscall
MIDIplay::noteUpdate
          (MIDIplay *this,size_t midCh,notes_iterator i,uint props_mask,int32_t select_adlchn)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  OPL3 *this_00;
  pl_cell<MIDIplay::MIDIchannel::NoteInfo> *ppVar10;
  reference pMVar11;
  Phys *pPVar12;
  reference pAVar13;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar14;
  ulong c_00;
  byte *pbVar15;
  double dVar16;
  byte local_161;
  byte local_119;
  double dStack_118;
  uint8_t vibrato;
  double phase;
  double bend;
  double midibend;
  MIDIchannel *chan;
  users_iterator d_2;
  uint_fast32_t brightness;
  bool is_percussion;
  MIDIchannel *ch;
  users_iterator d_1;
  users_iterator uStack_b8;
  bool do_erase_user;
  users_iterator k;
  uint16_t c_secondary;
  uint16_t c_1;
  Phys *ins_1;
  uint ccount_1;
  LocationData *d;
  users_iterator i_1;
  uint16_t c;
  Phys *ins;
  uint ctotal;
  uint ccount;
  Location local_5c;
  OplInstMeta *pOStack_58;
  Location my_loc;
  OplInstMeta *ains;
  int midiins;
  uint8_t vol;
  double currentTone;
  int16_t noteTone;
  NoteInfo *info;
  Synth *synth;
  int32_t select_adlchn_local;
  uint props_mask_local;
  size_t midCh_local;
  MIDIplay *this_local;
  notes_iterator i_local;
  
  this_local = (MIDIplay *)i.cell_;
  this_00 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator*(&this->m_synth);
  ppVar10 = pl_iterator<pl_cell<MIDIplay::MIDIchannel::NoteInfo>_>::operator->
                      ((pl_iterator<pl_cell<MIDIplay::MIDIchannel::NoteInfo>_> *)&this_local);
  sVar4 = (ppVar10->value).noteTone;
  dVar1 = (ppVar10->value).currentTone;
  bVar3 = (ppVar10->value).vol;
  iVar8 = (int)(ppVar10->value).midiins;
  pOStack_58 = (ppVar10->value).ains;
  local_5c.MidCh = (uint16_t)midCh;
  local_5c.note = (ppVar10->value).note;
  if (((ppVar10->value).isBlank & 1U) == 0) {
    ins._4_4_ = 0;
    uVar9 = (ppVar10->value).chip_channels_count;
    for (; ins._4_4_ < uVar9; ins._4_4_ = ins._4_4_ + 1) {
      pPVar12 = (ppVar10->value).chip_channels + ins._4_4_;
      i_1.cell_._6_2_ = pPVar12->chip_chan;
      if (((select_adlchn < 0) || ((uint)i_1.cell_._6_2_ == select_adlchn)) &&
         ((props_mask & 1) != 0)) {
        ::OPL3::setPatch(this_00,(ulong)i_1.cell_._6_2_,&pPVar12->op);
        pAVar13 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::
                  operator[](&this->m_chipChannels,(ulong)i_1.cell_._6_2_);
        d = (LocationData *)AdlChannel::find_or_create_user(pAVar13,&local_5c);
        bVar6 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end
                          ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)&d);
        if (!bVar6) {
          ppVar14 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator->
                              ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)&d);
          (ppVar14->value).sustained = 0;
          (ppVar14->value).vibdelay_us = 0;
          (ppVar14->value).fixed_sustain = pOStack_58->soundKeyOnMs == 40000;
          (ppVar14->value).kon_time_until_neglible_us =
               (long)(int)((uint)pOStack_58->soundKeyOnMs * 1000);
          *(undefined8 *)&(ppVar14->value).ins = *(undefined8 *)pPVar12;
          *(undefined8 *)((long)&(ppVar14->value).ins.op.carrier_E862 + 2) =
               *(undefined8 *)((long)&(pPVar12->op).carrier_E862 + 2);
        }
      }
    }
    for (ins_1._4_4_ = 0; ins_1._4_4_ < (ppVar10->value).chip_channels_count;
        ins_1._4_4_ = ins_1._4_4_ + 1) {
      pPVar12 = (ppVar10->value).chip_channels + ins_1._4_4_;
      k.cell_._6_2_ = pPVar12->chip_chan;
      k.cell_._4_2_ = (ppVar10->value).chip_channels[1].chip_chan;
      if ((select_adlchn < 0) || ((uint)k.cell_._6_2_ == select_adlchn)) {
        if ((props_mask & 0x20) == 0) {
          if ((props_mask & 2) != 0) {
            c_00 = (ulong)k.cell_._6_2_;
            pMVar11 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
                      operator[](&this->m_midiChannels,midCh);
            ::OPL3::setPan(this_00,c_00,pMVar11->panning);
          }
          if ((props_mask & 4) != 0) {
            pMVar11 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
                      operator[](&this->m_midiChannels,midCh);
            local_161 = 1;
            if (midCh != 9) {
              local_161 = pMVar11->is_xg_percussion;
            }
            d_2.cell_ = (pl_cell<MIDIplay::AdlChannel::LocationData> *)(ulong)pMVar11->brightness;
            if (((this->m_setup).fullRangeBrightnessCC74 & 1U) == 0) {
              if (d_2.cell_ < (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x40) {
                d_2.cell_ = (pl_cell<MIDIplay::AdlChannel::LocationData> *)((long)d_2.cell_ << 1);
              }
              else {
                d_2.cell_ = (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x7f;
              }
            }
            ::OPL3::touchNote(this_00,(ulong)k.cell_._6_2_,(ulong)bVar3,(ulong)pMVar11->volume,
                              (ulong)pMVar11->expression,(uint_fast32_t)d_2.cell_,
                              (bool)(local_161 & 1));
          }
          if ((props_mask & 8) != 0) {
            pAVar13 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::
                      operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
            chan = (MIDIchannel *)AdlChannel::find_user(pAVar13,&local_5c);
            bVar6 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end
                              ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)&chan);
            if ((bVar6) ||
               (ppVar14 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator->
                                    ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)
                                     &chan), (ppVar14->value).sustained == 0)) {
              midibend = (double)std::
                                 vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                                 ::operator[](&this->m_midiChannels,midCh);
              bend = (double)((reference)midibend)->bend * ((reference)midibend)->bendsense;
              phase = bend + (double)(int)(pPVar12->op).noteOffset;
              dStack_118 = 0.0;
              pbVar15 = std::max<unsigned_char>
                                  (&((reference)midibend)->vibrato,
                                   &((reference)midibend)->aftertouch);
              local_119 = *pbVar15;
              pbVar15 = std::max<unsigned_char>(&local_119,&(ppVar10->value).vibrato);
              local_119 = *pbVar15;
              if (((pOStack_58->flags & 1) != 0) && ((pPVar12->pseudo4op & 1U) != 0)) {
                dStack_118 = pOStack_58->voice2_fine_tune;
              }
              if ((local_119 != 0) &&
                 ((bVar6 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end
                                     ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)
                                      &chan), bVar6 ||
                  (ppVar14 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator->
                                       ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *
                                        )&chan),
                  *(long *)((long)midibend + 0xe0) <= (ppVar14->value).vibdelay_us)))) {
                uVar9 = (uint)local_119;
                dVar2 = *(double *)((long)midibend + 0xd8);
                dVar16 = sin(*(double *)((long)midibend + 200));
                phase = (double)uVar9 * dVar2 * dVar16 + phase;
              }
              ::OPL3::noteOn(this_00,(ulong)k.cell_._6_2_,(ulong)k.cell_._4_2_,
                             dVar1 + phase + dStack_118);
              if ((this->hooks).onNote != (NoteHook)0x0) {
                (*(this->hooks).onNote)
                          ((this->hooks).onNote_userData,(int)k.cell_._6_2_,(int)sVar4,iVar8,
                           (int)bVar3,bend);
              }
            }
          }
        }
        else {
          pMVar11 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
                    operator[](&this->m_midiChannels,midCh);
          if ((pMVar11->sustain & 1U) == 0) {
            pAVar13 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::
                      operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
            uStack_b8 = AdlChannel::find_user(pAVar13,&local_5c);
            bVar7 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end
                              (&stack0xffffffffffffff48);
            bVar6 = false;
            if (!bVar7) {
              ppVar14 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator->
                                  (&stack0xffffffffffffff48);
              bVar6 = ((ppVar14->value).sustained & 2) == 0;
            }
            if (bVar6) {
              pAVar13 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::
                        operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
              d_1.cell_ = (pl_cell<MIDIplay::AdlChannel::LocationData> *)
                          pl_list<MIDIplay::AdlChannel::LocationData>::erase
                                    (&pAVar13->users,uStack_b8.cell_);
            }
            if ((this->hooks).onNote != (NoteHook)0x0) {
              (*(this->hooks).onNote)
                        ((this->hooks).onNote_userData,(int)k.cell_._6_2_,(int)sVar4,iVar8,0,0.0);
            }
            if (bVar6) {
              pAVar13 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::
                        operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
              bVar6 = pl_list<MIDIplay::AdlChannel::LocationData>::empty(&pAVar13->users);
              if (bVar6) {
                ::OPL3::noteOff(this_00,(ulong)k.cell_._6_2_);
                if ((props_mask & 0x40) == 0) {
                  uVar5 = pOStack_58->soundKeyOffMs;
                  pAVar13 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                            ::operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
                  pAVar13->koff_time_until_neglible_us = (ulong)uVar5 * 1000;
                }
                else {
                  ::OPL3::touchNote(this_00,(ulong)k.cell_._6_2_,0,0,0,0x7f,false);
                  pAVar13 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                            ::operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
                  pAVar13->koff_time_until_neglible_us = 0;
                }
              }
            }
          }
          else {
            pAVar13 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::
                      operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
            ch = (MIDIchannel *)AdlChannel::find_or_create_user(pAVar13,&local_5c);
            bVar6 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end
                              ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)&ch);
            if (!bVar6) {
              ppVar14 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator->
                                  ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)&ch)
              ;
              (ppVar14->value).sustained = (ppVar14->value).sustained | 1;
            }
            if ((this->hooks).onNote != (NoteHook)0x0) {
              (*(this->hooks).onNote)
                        ((this->hooks).onNote_userData,(int)k.cell_._6_2_,(int)sVar4,iVar8,-1,0.0);
            }
          }
          MIDIchannel::NoteInfo::phys_erase_at(&ppVar10->value,pPVar12);
          ins_1._4_4_ = ins_1._4_4_ - 1;
        }
      }
    }
    if ((ppVar10->value).chip_channels_count == 0) {
      pMVar11 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
                operator[](&this->m_midiChannels,midCh);
      MIDIchannel::cleanupNote(pMVar11,(notes_iterator)this_local);
      pMVar11 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
                operator[](&this->m_midiChannels,midCh);
      pl_list<MIDIplay::MIDIchannel::NoteInfo>::erase(&pMVar11->activenotes,(iterator)this_local);
    }
  }
  else if ((props_mask & 0x20) != 0) {
    pMVar11 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::operator[]
                        (&this->m_midiChannels,midCh);
    pl_list<MIDIplay::MIDIchannel::NoteInfo>::erase(&pMVar11->activenotes,(iterator)this_local);
  }
  return;
}

Assistant:

void MIDIplay::noteUpdate(size_t midCh,
                          MIDIplay::MIDIchannel::notes_iterator i,
                          unsigned props_mask,
                          int32_t select_adlchn)
{
    Synth &synth = *m_synth;
    MIDIchannel::NoteInfo &info = i->value;
    const int16_t noteTone    = info.noteTone;
    const double currentTone    = info.currentTone;
    const uint8_t vol     = info.vol;
    const int midiins     = static_cast<int>(info.midiins);
    const OplInstMeta &ains = *info.ains;
    AdlChannel::Location my_loc;
    my_loc.MidCh = static_cast<uint16_t>(midCh);
    my_loc.note  = info.note;

    if(info.isBlank)
    {
        if(props_mask & Upd_Off)
            m_midiChannels[midCh].activenotes.erase(i);
        return;
    }

    for(unsigned ccount = 0, ctotal = info.chip_channels_count; ccount < ctotal; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn) continue;

        if(props_mask & Upd_Patch)
        {
            synth.setPatch(c, ins.op);
            AdlChannel::users_iterator i = m_chipChannels[c].find_or_create_user(my_loc);
            if(!i.is_end())    // inserts if necessary
            {
                AdlChannel::LocationData &d = i->value;
                d.sustained = AdlChannel::LocationData::Sustain_None;
                d.vibdelay_us = 0;
                d.fixed_sustain = (ains.soundKeyOnMs == static_cast<uint16_t>(OPLNoteOnMaxTime));
                d.kon_time_until_neglible_us = 1000 * ains.soundKeyOnMs;
                d.ins       = ins;
            }
        }
    }

    for(unsigned ccount = 0; ccount < info.chip_channels_count; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c          = ins.chip_chan;
        uint16_t c_secondary    = info.chip_channels[1].chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn)
            continue;

        if(props_mask & Upd_Off) // note off
        {
            if(!m_midiChannels[midCh].sustain)
            {
                AdlChannel::users_iterator k = m_chipChannels[c].find_user(my_loc);
                bool do_erase_user = (!k.is_end() && ((k->value.sustained & AdlChannel::LocationData::Sustain_Sostenuto) == 0));
                if(do_erase_user)
                    m_chipChannels[c].users.erase(k);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, 0, 0.0);

                if(do_erase_user && m_chipChannels[c].users.empty())
                {
                    synth.noteOff(c);
                    if(props_mask & Upd_Mute) // Mute the note
                    {
                        synth.touchNote(c, 0, 0, 0);
                        m_chipChannels[c].koff_time_until_neglible_us = 0;
                    }
                    else
                    {
                        m_chipChannels[c].koff_time_until_neglible_us = 1000 * int64_t(ains.soundKeyOffMs);
                    }
                }
            }
            else
            {
                // Sustain: Forget about the note, but don't key it off.
                //          Also will avoid overwriting it very soon.
                AdlChannel::users_iterator d = m_chipChannels[c].find_or_create_user(my_loc);
                if(!d.is_end())
                    d->value.sustained |= AdlChannel::LocationData::Sustain_Pedal; // note: not erased!
                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, -1, 0.0);
            }

            info.phys_erase_at(&ins);  // decrements channel count
            --ccount;  // adjusts index accordingly
            continue;
        }

        if(props_mask & Upd_Pan)
            synth.setPan(c, m_midiChannels[midCh].panning);

        if(props_mask & Upd_Volume)
        {
            const MIDIchannel &ch = m_midiChannels[midCh];
            bool is_percussion = (midCh == 9) || ch.is_xg_percussion;
            uint_fast32_t brightness = ch.brightness;

            if(!m_setup.fullRangeBrightnessCC74)
            {
                // Simulate post-High-Pass filter result which affects sounding by half level only
                if(brightness >= 64)
                    brightness = 127;
                else
                    brightness *= 2;
            }

            synth.touchNote(c,
                            vol,
                            ch.volume,
                            ch.expression,
                            brightness,
                            is_percussion);

            /* DEBUG ONLY!!!
            static uint32_t max = 0;

            if(volume == 0)
                max = 0;

            if(volume > max)
                max = volume;

            printf("%d\n", max);
            fflush(stdout);
            */
        }

        if(props_mask & Upd_Pitch)
        {
            AdlChannel::users_iterator d = m_chipChannels[c].find_user(my_loc);

            // Don't bend a sustained note
            if(d.is_end() || (d->value.sustained == AdlChannel::LocationData::Sustain_None))
            {
                MIDIchannel &chan = m_midiChannels[midCh];
                double midibend = chan.bend * chan.bendsense;
                double bend = midibend + ins.op.noteOffset;
                double phase = 0.0;
                uint8_t vibrato = std::max(chan.vibrato, chan.aftertouch);

                vibrato = std::max(vibrato, info.vibrato);

                if((ains.flags & OplInstMeta::Flag_Pseudo4op) && ins.pseudo4op)
                {
                    phase = ains.voice2_fine_tune;
                }

                if(vibrato && (d.is_end() || d->value.vibdelay_us >= chan.vibdelay_us))
                    bend += static_cast<double>(vibrato) * chan.vibdepth * std::sin(chan.vibpos);

                synth.noteOn(c, c_secondary, currentTone + bend + phase);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, vol, midibend);
            }
        }
    }

    if(info.chip_channels_count == 0)
    {
        m_midiChannels[midCh].cleanupNote(i);
        m_midiChannels[midCh].activenotes.erase(i);
    }
}